

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_ManUpdate(Nwk_Obj_t *pObj,Nwk_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  float fVar1;
  
  if (pObj->pMan != pObjNew->pMan) {
    __assert_fail("pObj->pMan == pObjNew->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x35e,"void Nwk_ManUpdate(Nwk_Obj_t *, Nwk_Obj_t *, Vec_Vec_t *)");
  }
  if (pObj == pObjNew) {
    __assert_fail("pObj != pObjNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x35f,"void Nwk_ManUpdate(Nwk_Obj_t *, Nwk_Obj_t *, Vec_Vec_t *)");
  }
  if (pObj->nFanouts < 1) {
    __assert_fail("Nwk_ObjFanoutNum(pObj) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x360,"void Nwk_ManUpdate(Nwk_Obj_t *, Nwk_Obj_t *, Vec_Vec_t *)");
  }
  if (((*(uint *)&pObj->field_0x20 & 7) == 3) && ((*(uint *)&pObjNew->field_0x20 & 7) != 2)) {
    Nwk_ObjTransferFanout(pObj,pObjNew);
    pObjNew->Level = pObj->Level;
    fVar1 = pObj->tRequired;
    pObjNew->tArrival = pObj->tArrival;
    pObjNew->tRequired = fVar1;
    pObj->tRequired = 1e+09;
    Nwk_NodeUpdateRequired(pObj);
    Nwk_ManDeleteNode_rec(pObj);
    Nwk_ManUpdateLevel(pObjNew);
    Nwk_NodeUpdateArrival(pObjNew);
    Nwk_NodeUpdateRequired(pObjNew);
    return;
  }
  __assert_fail("Nwk_ObjIsNode(pObj) && !Nwk_ObjIsCo(pObjNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                ,0x361,"void Nwk_ManUpdate(Nwk_Obj_t *, Nwk_Obj_t *, Vec_Vec_t *)");
}

Assistant:

void Nwk_ManUpdate( Nwk_Obj_t * pObj, Nwk_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    assert( pObj->pMan == pObjNew->pMan );
    assert( pObj != pObjNew );
    assert( Nwk_ObjFanoutNum(pObj) > 0 );
    assert( Nwk_ObjIsNode(pObj) && !Nwk_ObjIsCo(pObjNew) );
    // transfer fanouts to the old node
    Nwk_ObjTransferFanout( pObj, pObjNew );
    // transfer the timing information
    // (this is needed because updating level happens if the level has changed;
    // when we set the old level, it will be recomputed by the level updating
    // procedure, which will update level of other nodes if there is a difference)
    pObjNew->Level = pObj->Level;
    pObjNew->tArrival = pObj->tArrival;
    pObjNew->tRequired = pObj->tRequired;
    // update required times of the old fanins
    pObj->tRequired = TIM_ETERNITY;
    Nwk_NodeUpdateRequired( pObj );
    // remove the old node
    Nwk_ManDeleteNode_rec( pObj );
    // update the information of the new node
    Nwk_ManUpdateLevel( pObjNew );
    Nwk_NodeUpdateArrival( pObjNew );
    Nwk_NodeUpdateRequired( pObjNew );
//Nwk_ManVerifyTiming( pObjNew->pMan );
}